

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

bool __thiscall ON_SubDQuadNeighborhood::IsValid(ON_SubDQuadNeighborhood *this)

{
  ON_SubDFace *this_00;
  ON_2dex OVar1;
  bool bVar2;
  bool bVar3;
  ON_SubDVertex *pOVar4;
  ON__UINT_PTR OVar5;
  ON_SubDFace *pOVar6;
  ON_SubDFace *pOVar7;
  ON_SubDEdge *pOVar8;
  ON__UINT_PTR OVar9;
  ON_SubDEdge *pOVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint k_1;
  ON_SubDVertex *v_1;
  uint j;
  uint corner_face_vi;
  ON_SubDEdge *e;
  uint vei;
  bool bCornerShouldExist;
  uint side_face_edge_count;
  uint k;
  ON_SubDEdgePtr side_face_eptr;
  uint side_fei [3];
  ON_SubDFace *edge_faces [2];
  int local_1e0;
  uint crease_count;
  uint dart_count;
  uint fi_1;
  ON_SubDFace *corner_face [4];
  ON_SubDFace *side_face [4];
  uint local_18c;
  uint fi;
  ON_SubDEdge *quad_edge [4];
  ON_SubDEdgePtr quad_eptr [4];
  ON_SubDVertex *quad_vertex [4];
  int fvi_map [4];
  int local_110;
  int iStack_10c;
  ON_2dex dex;
  ON_2dex grid_side_dex [4] [2];
  ON_2dex grid_corner_dex [4];
  ON_2dex grid_quad_vertex_dex [4];
  ON_2dex face_side_dex [4];
  ON_2dex face_corner_dex [4];
  ON_SubDVertex *v;
  int quad_dir;
  int quad_fvi0;
  ON_SubDFace *quad_face;
  uint i_2;
  uint i_1;
  uint i;
  uint count;
  ON_SubDQuadNeighborhood *this_local;
  
  i_1 = 0;
  for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
    if ((this->m_bExtraordinaryCornerVertex[i_2] & 1U) != 0) {
      i_1 = i_1 + 1;
    }
  }
  if (i_1 == this->m_extraordinary_corner_vertex_count) {
    i_1 = 0;
    for (quad_face._4_4_ = 0; quad_face._4_4_ < 4; quad_face._4_4_ = quad_face._4_4_ + 1) {
      if ((this->m_bExactQuadrantPatch[quad_face._4_4_] & 1U) != 0) {
        if ((this->m_bExtraordinaryCornerVertex[quad_face._4_4_] & 1U) != 0) {
          ON_SubDIncrementErrorCount();
          return false;
        }
        i_1 = i_1 + 1;
      }
    }
    if (i_1 == this->m_exact_quadrant_patch_count) {
      i_1 = 0;
      for (quad_face._0_4_ = 0; (uint)quad_face < 4; quad_face._0_4_ = (uint)quad_face + 1) {
        if ((this->m_bBoundaryCrease[(uint)quad_face] & 1U) != 0) {
          i_1 = i_1 + 1;
        }
      }
      if (i_1 == this->m_boundary_crease_count) {
        this_00 = this->m_face_grid[1][1];
        if ((this_00 == (ON_SubDFace *)0x0) || (this_00->m_edge_count != 4)) {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
        }
        else {
          v._0_4_ = 0;
          for (v._4_4_ = 0; (int)v._4_4_ < 4; v._4_4_ = v._4_4_ + 1) {
            pOVar4 = ON_SubDFace::Vertex(this_00,v._4_4_);
            if (pOVar4 == (ON_SubDVertex *)0x0) {
              ON_SubDIncrementErrorCount();
              return false;
            }
            if (this->m_vertex_grid[1][1] == pOVar4) {
              pOVar4 = ON_SubDFace::Vertex(this_00,(int)(v._4_4_ + 1) % 4);
              if (pOVar4 == (ON_SubDVertex *)0x0) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if (this->m_vertex_grid[2][1] == pOVar4) {
                v._0_4_ = 1;
              }
              else {
                if (this->m_vertex_grid[1][2] != pOVar4) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                v._0_4_ = -1;
              }
              break;
            }
          }
          if (((int)v == 0) || (3 < (int)v._4_4_)) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
          }
          else {
            ON_2dex::ON_2dex(face_side_dex + 3,0,0);
            ON_2dex::ON_2dex(face_corner_dex,2,0);
            ON_2dex::ON_2dex(face_corner_dex + 1,2,2);
            ON_2dex::ON_2dex(face_corner_dex + 2,0,2);
            ON_2dex::ON_2dex(grid_quad_vertex_dex + 3,1,0);
            ON_2dex::ON_2dex(face_side_dex,2,1);
            ON_2dex::ON_2dex(face_side_dex + 1,1,2);
            ON_2dex::ON_2dex(face_side_dex + 2,0,1);
            ON_2dex::ON_2dex(grid_corner_dex + 3,1,1);
            ON_2dex::ON_2dex(grid_quad_vertex_dex,2,1);
            ON_2dex::ON_2dex(grid_quad_vertex_dex + 1,2,2);
            ON_2dex::ON_2dex(grid_quad_vertex_dex + 2,1,2);
            ON_2dex::ON_2dex(grid_side_dex[3] + 1,0,0);
            ON_2dex::ON_2dex(grid_corner_dex,3,0);
            ON_2dex::ON_2dex(grid_corner_dex + 1,3,3);
            ON_2dex::ON_2dex(grid_corner_dex + 2,0,3);
            ON_2dex::ON_2dex(&dex,1,0);
            ON_2dex::ON_2dex(grid_side_dex[0],2,0);
            ON_2dex::ON_2dex(grid_side_dex[0] + 1,3,1);
            ON_2dex::ON_2dex(grid_side_dex[1],3,2);
            ON_2dex::ON_2dex(grid_side_dex[1] + 1,2,3);
            ON_2dex::ON_2dex(grid_side_dex[2],1,3);
            ON_2dex::ON_2dex(grid_side_dex[2] + 1,0,2);
            ON_2dex::ON_2dex(grid_side_dex[3],0,1);
            uVar11 = (int)(v._4_4_ + 4 + (int)v) % 4;
            uVar12 = (int)(v._4_4_ + 4 + (int)v * 2) % 4;
            uVar13 = (int)(v._4_4_ + 4 + (int)v * 3) % 4;
            quad_eptr[3].m_ptr = (ON__UINT_PTR)ON_SubDFace::Vertex(this_00,v._4_4_);
            ON_SubDFace::Vertex(this_00,uVar11);
            ON_SubDFace::Vertex(this_00,uVar12);
            ON_SubDFace::Vertex(this_00,uVar13);
            quad_edge[3] = (ON_SubDEdge *)this_00->m_edge4[(int)v._4_4_].m_ptr;
            quad_eptr[0].m_ptr = this_00->m_edge4[(int)uVar11].m_ptr;
            quad_eptr[1].m_ptr = this_00->m_edge4[(int)uVar12].m_ptr;
            quad_eptr[2].m_ptr = this_00->m_edge4[(int)uVar13].m_ptr;
            ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)(quad_edge + 3));
            quad_edge[0] = ON_SubDEdgePtr::Edge(quad_eptr);
            quad_edge[1] = ON_SubDEdgePtr::Edge(quad_eptr + 1);
            quad_edge[2] = ON_SubDEdgePtr::Edge(quad_eptr + 2);
            for (local_18c = 0; local_18c < 4; local_18c = local_18c + 1) {
              if (quad_edge[(ulong)local_18c - 1] == (ON_SubDEdge *)0x0) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if (quad_edge[(ulong)local_18c - 1]->m_vertex[0] == (ON_SubDVertex *)0x0) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if (quad_edge[(ulong)local_18c - 1]->m_vertex[1] == (ON_SubDVertex *)0x0) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if (quad_edge[(ulong)local_18c - 1]->m_face_count == 0) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if (quad_eptr[(ulong)local_18c + 3].m_ptr == 0) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if ((*(ushort *)(quad_eptr[(ulong)local_18c + 3].m_ptr + 0x68) < 2) ||
                 (*(long *)(quad_eptr[(ulong)local_18c + 3].m_ptr + 0x70) == 0)) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if ((*(short *)(quad_eptr[(ulong)local_18c + 3].m_ptr + 0x6a) == 0) ||
                 (*(long *)(quad_eptr[(ulong)local_18c + 3].m_ptr + 0x78) == 0)) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              local_110 = grid_corner_dex[(ulong)local_18c + 3].i;
              iStack_10c = grid_corner_dex[(ulong)local_18c + 3].j;
              if ((ON_SubDVertex *)quad_eptr[(ulong)local_18c + 3].m_ptr !=
                  this->m_vertex_grid[local_110][iStack_10c]) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if (quad_edge[(ulong)local_18c - 1] != this->m_center_edges[local_18c]) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              OVar9 = quad_eptr[(ulong)(local_18c + 1 & 3) + 3].m_ptr;
              pOVar10 = quad_edge[(ulong)local_18c - 1];
              OVar5 = ON_SubDEdgePtr::EdgeDirection
                                ((ON_SubDEdgePtr *)(quad_edge + (ulong)local_18c + 3));
              if (OVar9 != *(ON__UINT_PTR *)((long)pOVar10 + (1 - OVar5) * 8 + 0x80)) {
                ON_SubDIncrementErrorCount();
                return false;
              }
            }
            memset(corner_face + 3,0,0x20);
            memset(&dart_count,0,0x20);
            for (crease_count = 0; crease_count < 4; crease_count = crease_count + 1) {
              local_110 = grid_corner_dex[(ulong)crease_count + 3].i;
              iStack_10c = grid_corner_dex[(ulong)crease_count + 3].j;
              if ((ON_SubDVertex *)quad_eptr[(ulong)crease_count + 3].m_ptr !=
                  this->m_vertex_grid[local_110][iStack_10c]) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              local_110 = grid_quad_vertex_dex[(ulong)crease_count + 3].i;
              iStack_10c = grid_quad_vertex_dex[(ulong)crease_count + 3].j;
              corner_face[(ulong)crease_count + 3] = this->m_face_grid[local_110][iStack_10c];
              if (this_00 == corner_face[(ulong)crease_count + 3]) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              if ((this->m_bBoundaryCrease[crease_count] & 1U) == 0) {
                if (corner_face[(ulong)crease_count + 3] == (ON_SubDFace *)0x0) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                if (quad_edge[(ulong)crease_count - 1]->m_face_count != 2) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                bVar2 = ON_SubDEdge::IsCrease(quad_edge[(ulong)crease_count - 1]);
                if (bVar2) {
                  local_1e0 = 0;
                  edge_faces[1]._4_4_ = 0;
                  if (quad_edge[(ulong)crease_count - 1]->m_vertex[0]->m_vertex_tag == Dart) {
                    local_1e0 = 1;
                  }
                  else {
                    bVar2 = ON_SubDVertex::IsCreaseOrCorner
                                      (quad_edge[(ulong)crease_count - 1]->m_vertex[0]);
                    if (!bVar2) {
                      ON_SubDIncrementErrorCount();
                      return false;
                    }
                    edge_faces[1]._4_4_ = 1;
                  }
                  if (quad_edge[(ulong)crease_count - 1]->m_vertex[1]->m_vertex_tag == Dart) {
                    local_1e0 = local_1e0 + 1;
                  }
                  else {
                    bVar2 = ON_SubDVertex::IsCreaseOrCorner
                                      (quad_edge[(ulong)crease_count - 1]->m_vertex[1]);
                    if (!bVar2) {
                      ON_SubDIncrementErrorCount();
                      return false;
                    }
                    edge_faces[1]._4_4_ = edge_faces[1]._4_4_ + 1;
                  }
                  if (local_1e0 == 0) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                  if (local_1e0 + edge_faces[1]._4_4_ != 2) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                }
                else {
                  bVar2 = ON_SubDEdge::IsSmooth(quad_edge[(ulong)crease_count - 1]);
                  if (!bVar2) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                }
                pOVar6 = (ON_SubDFace *)
                         (quad_edge[(ulong)crease_count - 1]->m_face2[0].m_ptr & 0xfffffffffffffff8)
                ;
                pOVar7 = (ON_SubDFace *)
                         (quad_edge[(ulong)crease_count - 1]->m_face2[1].m_ptr & 0xfffffffffffffff8)
                ;
                if (this_00 == pOVar6) {
                  if (corner_face[(ulong)crease_count + 3] != pOVar7) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                }
                else {
                  if (this_00 != pOVar7) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                  if (corner_face[(ulong)crease_count + 3] != pOVar6) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                }
                if ((this->m_edge_grid[crease_count][0] == (ON_SubDEdge *)0x0) ||
                   (this->m_edge_grid[crease_count][1] == (ON_SubDEdge *)0x0)) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                memset((void *)((long)&side_face_eptr.m_ptr + 4),0,0xc);
                uVar11 = ON_SubDFace::EdgeArrayIndex
                                   (corner_face[(ulong)crease_count + 3],
                                    quad_edge[(ulong)crease_count - 1]);
                if (uVar11 == 0xffffffff) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                _side_face_edge_count =
                     ON_SubDFace::EdgePtr(corner_face[(ulong)crease_count + 3],uVar11);
                pOVar10 = quad_edge[(ulong)crease_count - 1];
                pOVar8 = ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)&side_face_edge_count);
                if (pOVar10 != pOVar8) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                OVar9 = ON_SubDEdgePtr::EdgeDirection((ON_SubDEdgePtr *)&side_face_edge_count);
                OVar5 = ON_SubDEdgePtr::EdgeDirection
                                  ((ON_SubDEdgePtr *)(quad_edge + (ulong)crease_count + 3));
                uVar12 = 0;
                if (OVar9 == OVar5) {
                  uVar12 = 2;
                }
                uVar13 = (uint)corner_face[(ulong)crease_count + 3]->m_edge_count;
                *(uint *)((long)&side_face_eptr.m_ptr + (ulong)(2 - uVar12) * 4 + 4) =
                     ((uVar11 + uVar13) - 1) % uVar13;
                *(uint *)((long)&side_face_eptr.m_ptr + (ulong)uVar12 * 4 + 4) =
                     (uVar11 + 1) % uVar13;
                pOVar10 = this->m_edge_grid[crease_count][0];
                pOVar8 = ON_SubDFace::Edge(corner_face[(ulong)crease_count + 3],
                                           side_face_eptr.m_ptr._4_4_);
                if (pOVar10 != pOVar8) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                pOVar10 = this->m_edge_grid[crease_count][1];
                pOVar8 = ON_SubDFace::Edge(corner_face[(ulong)crease_count + 3],side_fei[0]);
                if (pOVar10 != pOVar8) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
              }
              else {
                bVar2 = ON_SubDEdge::IsCrease(quad_edge[(ulong)crease_count - 1]);
                if (!bVar2) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                uVar11 = ON_SubDEdge::FaceArrayIndex(quad_edge[(ulong)crease_count - 1],this_00);
                if (uVar11 == 0xffffffff) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                if (quad_edge[(ulong)crease_count - 1]->m_face_count == 2) {
                  bVar2 = ON_SubDVertex::IsCreaseOrCorner
                                    (quad_edge[(ulong)crease_count - 1]->m_vertex[0]);
                  if (!bVar2) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                  bVar2 = ON_SubDVertex::IsCreaseOrCorner
                                    (quad_edge[(ulong)crease_count - 1]->m_vertex[1]);
                  if (!bVar2) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                }
                if (corner_face[(ulong)crease_count + 3] != (ON_SubDFace *)0x0) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
              }
              local_110 = face_side_dex[(ulong)crease_count + 3].i;
              iStack_10c = face_side_dex[(ulong)crease_count + 3].j;
              *(ON_SubDFace **)(&dart_count + (ulong)crease_count * 2) =
                   this->m_face_grid[local_110][iStack_10c];
              if (this_00 == *(ON_SubDFace **)(&dart_count + (ulong)crease_count * 2)) {
                ON_SubDIncrementErrorCount();
                return false;
              }
              bVar2 = false;
              if ((*(short *)(quad_eptr[(ulong)crease_count + 3].m_ptr + 0x68) == 4) &&
                 (bVar2 = false, *(short *)(quad_eptr[(ulong)crease_count + 3].m_ptr + 0x6a) == 4))
              {
                bVar3 = ON_SubDVertex::IsSmoothOrDart
                                  ((ON_SubDVertex *)quad_eptr[(ulong)crease_count + 3].m_ptr);
                bVar2 = false;
                if ((bVar3) && (bVar2 = false, (this->m_bBoundaryCrease[crease_count] & 1U) == 0)) {
                  bVar2 = (this->m_bBoundaryCrease[crease_count + 3 & 3] & 1U) == 0;
                }
              }
              if (bVar2) {
                for (e._0_4_ = 0; (uint)e < 4; e._0_4_ = (uint)e + 1) {
                  pOVar10 = ON_SubDVertex::Edge((ON_SubDVertex *)
                                                quad_eptr[(ulong)crease_count + 3].m_ptr,(uint)e);
                  if (pOVar10 == (ON_SubDEdge *)0x0) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                  if ((pOVar10->m_face_count != 2) ||
                     ((bVar3 = ON_SubDEdge::IsSmooth(pOVar10), !bVar3 &&
                      ((bVar3 = ON_SubDEdge::IsCrease(pOVar10), !bVar3 ||
                       (*(char *)(quad_eptr[(ulong)crease_count + 3].m_ptr + 0x60) != '\x04')))))) {
                    bVar2 = ON_SubDEdge::IsCrease(pOVar10);
                    if (!bVar2) {
                      ON_SubDIncrementErrorCount();
                      return false;
                    }
                    bVar2 = false;
                    break;
                  }
                }
              }
              OVar1 = grid_corner_dex[(ulong)crease_count - 1];
              if (bVar2) {
                if (*(long *)(&dart_count + (ulong)crease_count * 2) == 0) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                if (corner_face[(ulong)crease_count + 3] ==
                    *(ON_SubDFace **)(&dart_count + (ulong)crease_count * 2)) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                uVar11 = ON_SubDFace::VertexIndex
                                   (*(ON_SubDFace **)(&dart_count + (ulong)crease_count * 2),
                                    (ON_SubDVertex *)quad_eptr[(ulong)crease_count + 3].m_ptr);
                if (uVar11 == 0xffffffff) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                uVar11 = ON_SubDFace::VertexIndex
                                   (*(ON_SubDFace **)(&dart_count + (ulong)crease_count * 2),
                                    (ON_SubDVertex *)quad_eptr[(ulong)crease_count + 3].m_ptr);
                if (uVar11 == 0xffffffff) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                local_110 = OVar1.i;
                iStack_10c = OVar1.j;
                if (*(short *)(*(long *)(&dart_count + (ulong)crease_count * 2) + 0x9c) == 4) {
                  if (this->m_vertex_grid[local_110][iStack_10c] == (ON_SubDVertex *)0x0) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                  pOVar4 = ON_SubDFace::Vertex(*(ON_SubDFace **)
                                                (&dart_count + (ulong)crease_count * 2),
                                               uVar11 + 2 & 3);
                  if (pOVar4 != this->m_vertex_grid[local_110][iStack_10c]) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                }
                else if (this->m_vertex_grid[local_110][iStack_10c] != (ON_SubDVertex *)0x0) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
              }
              if ((this->m_bBoundaryCrease[crease_count] & 1U) == 0) {
                for (v_1._0_4_ = 0; (uint)v_1 < 2; v_1._0_4_ = (uint)v_1 + 1) {
                  uVar11 = (uint)((ON_SubDVertex *)
                                  quad_eptr[(ulong)(crease_count + (uint)v_1 & 3) + 3].m_ptr ==
                                 this->m_edge_grid[crease_count][(uint)v_1]->m_vertex[0]);
                  if ((ON_SubDVertex *)quad_eptr[(ulong)(crease_count + (uint)v_1 & 3) + 3].m_ptr !=
                      this->m_edge_grid[crease_count][(uint)v_1]->m_vertex[1 - uVar11]) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                  local_110 = grid_side_dex[(ulong)crease_count - 1][(ulong)(uint)v_1 + 1].i;
                  iStack_10c = grid_side_dex[(ulong)crease_count - 1][(ulong)(uint)v_1 + 1].j;
                  if (this->m_vertex_grid[local_110][iStack_10c] !=
                      this->m_edge_grid[crease_count][(uint)v_1]->m_vertex[uVar11]) {
                    ON_SubDIncrementErrorCount();
                    return false;
                  }
                }
              }
            }
            this_local._7_1_ = true;
          }
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDQuadNeighborhood::IsValid() const
{
  unsigned int count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bExtraordinaryCornerVertex[i])
      count++;
  }
  if (count != m_extraordinary_corner_vertex_count)
    return ON_SUBD_RETURN_ERROR(false);

  count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bExactQuadrantPatch[i])
    {
      if (m_bExtraordinaryCornerVertex[i] )
        return ON_SUBD_RETURN_ERROR(false);
      count++;
    }
  }
  if (count != m_exact_quadrant_patch_count)
    return ON_SUBD_RETURN_ERROR(false);

  count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bBoundaryCrease[i])
    {
      //if ( m_bDartCrease[i] )
      //  return ON_SUBD_RETURN_ERROR(false);
      count++;
    }
  }
  if (count != m_boundary_crease_count)
    return ON_SUBD_RETURN_ERROR(false);

  //count = 0;
  //for (unsigned int i = 0; i < 4; i++)
  //{
  //  if (m_bDartCrease[i])
  //    count++;
  //}
  //if (count != m_dart_crease_count)
  //  return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDFace* quad_face = m_face_grid[1][1];
  if (nullptr == quad_face || 4 != quad_face->m_edge_count)
    return ON_SUBD_RETURN_ERROR(false);

  int quad_fvi0 = 0;
  int quad_dir = 0;
  {
    for (quad_fvi0 = 0; quad_fvi0 < 4; quad_fvi0++)
    {
      const ON_SubDVertex* v = quad_face->Vertex(quad_fvi0);
      if ( nullptr == v )
        return ON_SUBD_RETURN_ERROR(false);
      if (m_vertex_grid[1][1] == v)
      {
        v = quad_face->Vertex((quad_fvi0+1)%4);
        if ( nullptr == v )
          return ON_SUBD_RETURN_ERROR(false);
        if (m_vertex_grid[2][1] == v)
          quad_dir = 1;
        else if (m_vertex_grid[1][2] == v)
          quad_dir = -1;
        else
          return ON_SUBD_RETURN_ERROR(false);
        break;
      }
    }
    if (0 == quad_dir || quad_fvi0 >= 4)
      return ON_SUBD_RETURN_ERROR(false);
  }

  const ON_2dex face_corner_dex[4] = { { 0, 0 }, { 2, 0 }, { 2, 2 }, { 0, 2 } };
  const ON_2dex face_side_dex[4] = { { 1, 0 }, { 2, 1 }, { 1, 2 }, { 0, 1 } };

  const ON_2dex grid_quad_vertex_dex[4] = { { 1,1 }, { 2,1 }, { 2,2 }, { 1,2 } };
  const ON_2dex grid_corner_dex[4] = { { 0, 0 }, { 3, 0 }, { 3, 3 }, { 0, 3 } };
  const ON_2dex grid_side_dex[4][2] = { {{ 1, 0 }, { 2, 0 }}, {{ 3, 1 }, { 3, 2 }}, {{ 2, 3 }, { 1, 3 }}, {{ 0, 2 }, { 0, 1 }} };

  ON_2dex dex;

  const int fvi_map[4] = {
    quad_fvi0,
    (quad_fvi0+4+quad_dir)%4,
    (quad_fvi0+4+2*quad_dir)%4,
    (quad_fvi0+4+3*quad_dir)%4};

  const ON_SubDVertex* quad_vertex[4] = {
    quad_face->Vertex(fvi_map[0]), 
    quad_face->Vertex(fvi_map[1]),
    quad_face->Vertex(fvi_map[2]),
    quad_face->Vertex(fvi_map[3]) };

  const ON_SubDEdgePtr quad_eptr[4] = {
    quad_face->m_edge4[fvi_map[0]],
    quad_face->m_edge4[fvi_map[1]], 
    quad_face->m_edge4[fvi_map[2]],
    quad_face->m_edge4[fvi_map[3]] };

  const ON_SubDEdge* quad_edge[4] = {
    quad_eptr[0].Edge(),
    quad_eptr[1].Edge(),
    quad_eptr[2].Edge(),
    quad_eptr[3].Edge() };

  for (unsigned int fi = 0; fi < 4; fi++)
  {
    if (nullptr == quad_edge[fi])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_edge[fi]->m_vertex[0])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_edge[fi]->m_vertex[1])
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_edge[fi]->m_face_count < 1)
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_vertex[fi])
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_vertex[fi]->m_edge_count < 2 || nullptr == quad_vertex[fi]->m_edges )
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_vertex[fi]->m_face_count < 1 || nullptr == quad_vertex[fi]->m_faces )
      return ON_SUBD_RETURN_ERROR(false);
    dex = grid_quad_vertex_dex[fi];
    if ( quad_vertex[fi] != m_vertex_grid[dex.i][dex.j])
      return ON_SUBD_RETURN_ERROR(false);
    if ( quad_edge[fi] != m_center_edges[fi] )
      return ON_SUBD_RETURN_ERROR(false);
    if ( quad_vertex[(fi+1)%4] != quad_edge[fi]->m_vertex[1-quad_eptr[fi].EdgeDirection()] )
      return ON_SUBD_RETURN_ERROR(false);
  }
  
  const ON_SubDFace* side_face[4] = {};
  const ON_SubDFace* corner_face[4] = {};

  for (unsigned int fi = 0; fi < 4; fi++)
  {
    dex = grid_quad_vertex_dex[fi];
    if (quad_vertex[fi] != m_vertex_grid[dex.i][dex.j])
      return ON_SUBD_RETURN_ERROR(false);

    dex = face_side_dex[fi];
    side_face[fi] = m_face_grid[dex.i][dex.j];
    if ( quad_face == side_face[fi])
      return ON_SUBD_RETURN_ERROR(false);

    if (m_bBoundaryCrease[fi])
    {
      // A tag of ON_SubDEdgeTag::SmoothX is an error here
      if ( false == quad_edge[fi]->IsCrease() )
        return ON_SUBD_RETURN_ERROR(false);

      if ( ON_UNSET_UINT_INDEX == quad_edge[fi]->FaceArrayIndex(quad_face) )
        return ON_SUBD_RETURN_ERROR(false);

      if (2 == quad_edge[fi]->m_face_count)
      {
        if ( false == quad_edge[fi]->m_vertex[0]->IsCreaseOrCorner())
          return ON_SUBD_RETURN_ERROR(false);
        if ( false == quad_edge[fi]->m_vertex[1]->IsCreaseOrCorner())
          return ON_SUBD_RETURN_ERROR(false);
      }

      if (nullptr != side_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
    }
    else
    {
      if (nullptr == side_face[fi])
        return ON_SUBD_RETURN_ERROR(false);

      // A tag of ON_SubDEdgeTag::SmoothX is permitted here
      if ( 2 != quad_edge[fi]->m_face_count)
        return ON_SUBD_RETURN_ERROR(false);

      if (quad_edge[fi]->IsCrease())
      {
        unsigned int dart_count = 0;
        unsigned int crease_count = 0;
        if ( ON_SubDVertexTag::Dart == quad_edge[fi]->m_vertex[0]->m_vertex_tag)
          dart_count++;
        else if ( quad_edge[fi]->m_vertex[0]->IsCreaseOrCorner())
          crease_count++;
        else
          return ON_SUBD_RETURN_ERROR(false);

        if ( ON_SubDVertexTag::Dart == quad_edge[fi]->m_vertex[1]->m_vertex_tag)
          dart_count++;
        else if ( quad_edge[fi]->m_vertex[1]->IsCreaseOrCorner())
          crease_count++;
        else
          return ON_SUBD_RETURN_ERROR(false);

        if ( 0 == dart_count )
          return ON_SUBD_RETURN_ERROR(false);

        if ( 2 != dart_count + crease_count )
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (false == quad_edge[fi]->IsSmooth())
          return ON_SUBD_RETURN_ERROR(false);
      }
      const ON_SubDFace* edge_faces[2] = { ON_SUBD_FACE_POINTER(quad_edge[fi]->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(quad_edge[fi]->m_face2[1].m_ptr) };
      if (quad_face == edge_faces[0])
      {
        if (side_face[fi] != edge_faces[1])
          return ON_SUBD_RETURN_ERROR(false);
      }
      else if (quad_face == edge_faces[1])
      {
        if (side_face[fi] != edge_faces[0])
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
        return ON_SUBD_RETURN_ERROR(false);

      if (nullptr == m_edge_grid[fi][0] || nullptr == m_edge_grid[fi][1])
        return ON_SUBD_RETURN_ERROR(false);

      unsigned int side_fei[3] = {};
      side_fei[1] = side_face[fi]->EdgeArrayIndex(quad_edge[fi]);
      if ( ON_UNSET_UINT_INDEX == side_fei[1] )
        return ON_SUBD_RETURN_ERROR(false);

      const ON_SubDEdgePtr side_face_eptr = side_face[fi]->EdgePtr(side_fei[1]);
      if ( quad_edge[fi] != side_face_eptr.Edge())
        return ON_SUBD_RETURN_ERROR(false);

      unsigned int k = (side_face_eptr.EdgeDirection() == quad_eptr[fi].EdgeDirection()) ? 2 : 0;
      unsigned int side_face_edge_count = side_face[fi]->m_edge_count;
      side_fei[2-k] = (side_fei[1] + side_face_edge_count - 1) % side_face_edge_count;
      side_fei[k] = (side_fei[1] + 1) % side_face_edge_count;
      if ( m_edge_grid[fi][0] != side_face[fi]->Edge(side_fei[0]))
        return ON_SUBD_RETURN_ERROR(false);
      if ( m_edge_grid[fi][1] != side_face[fi]->Edge(side_fei[2]))
        return ON_SUBD_RETURN_ERROR(false);
    }

    dex = face_corner_dex[fi];
    corner_face[fi] = m_face_grid[dex.i][dex.j];
    if ( quad_face == corner_face[fi])
      return ON_SUBD_RETURN_ERROR(false);

    bool bCornerShouldExist 
      = 4 == quad_vertex[fi]->m_edge_count
      && 4 == quad_vertex[fi]->m_face_count
      && quad_vertex[fi]->IsSmoothOrDart()
      && false == m_bBoundaryCrease[fi]
      && false == m_bBoundaryCrease[(fi + 3) % 4];
    if (bCornerShouldExist)
    {
      for (unsigned int vei = 0; vei < 4; vei++)
      {
        const ON_SubDEdge* e = quad_vertex[fi]->Edge(vei);
        if ( nullptr == e)
          return ON_SUBD_RETURN_ERROR(false);
        if (2 == e->m_face_count)
        {
          if (e->IsSmooth())
            continue;
          if (e->IsCrease() && ON_SubDVertexTag::Dart == quad_vertex[fi]->m_vertex_tag)
            continue;
        }
        if (false == e->IsCrease())
          return ON_SUBD_RETURN_ERROR(false);
        bCornerShouldExist = false;
        break;
      }
    }

    dex = grid_corner_dex[fi];
    if (bCornerShouldExist)
    {
      if (nullptr == corner_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
      if (side_face[fi] == corner_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_UNSET_UINT_INDEX == corner_face[fi]->VertexIndex(quad_vertex[fi]))
        return ON_SUBD_RETURN_ERROR(false);
      const unsigned int corner_face_vi = corner_face[fi]->VertexIndex(quad_vertex[fi]);
      if ( ON_UNSET_UINT_INDEX == corner_face_vi)
        return ON_SUBD_RETURN_ERROR(false);
      if (4 == corner_face[fi]->m_edge_count)
      {
        if (nullptr == m_vertex_grid[dex.i][dex.j])
          return ON_SUBD_RETURN_ERROR(false);
        if ( corner_face[fi]->Vertex((corner_face_vi+2)%4) != m_vertex_grid[dex.i][dex.j] )
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (nullptr != m_vertex_grid[dex.i][dex.j])
          return ON_SUBD_RETURN_ERROR(false);
      }
    }
    //else 
    //{
    //  if (nullptr != corner_face[fi])
    //    return ON_SUBD_RETURN_ERROR(false);
    //  if (nullptr != m_vertex_grid[dex.i][dex.j])
    //    return ON_SUBD_RETURN_ERROR(false);
    //}

    if (false == m_bBoundaryCrease[fi])
    {
      for (unsigned int j = 0; j < 2; j++)
      {
        const ON_SubDVertex* v = quad_vertex[(fi + j) % 4];
        unsigned int k = (v != m_edge_grid[fi][j]->m_vertex[0]) ? 0 : 1;
        if (v != m_edge_grid[fi][j]->m_vertex[1 - k])
          return ON_SUBD_RETURN_ERROR(false);
        dex = grid_side_dex[fi][j];
        if (m_vertex_grid[dex.i][dex.j] != m_edge_grid[fi][j]->m_vertex[k])
          return ON_SUBD_RETURN_ERROR(false);
      }
    }
  }

  return true;
}